

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

void __thiscall peg::Capture::Capture(Capture *this,shared_ptr<peg::Ope> *ope,MatchAction *ma)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__Capture_00171fe0;
  (this->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ope->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (ope->super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->ope_).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::function<void_(const_char_*,_unsigned_long,_peg::Context_&)>::function
            (&this->match_action_,ma);
  return;
}

Assistant:

Capture(const std::shared_ptr<Ope> &ope, MatchAction ma)
      : ope_(ope), match_action_(ma) {}